

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O2

string * flow::lang::escape(string *__return_storage_ptr__,string *value)

{
  pointer pcVar1;
  size_type sVar2;
  char in_DL;
  char extraout_DL;
  size_type sVar3;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    escape_abi_cxx11_(&sStack_48,(lang *)(ulong)(uint)(int)pcVar1[sVar3],in_DL);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    in_DL = extraout_DL;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape(const std::string& value)  // {{{
{
  std::string result;

  for (const char ch : value) result += escape(ch);

  return result;
}